

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

JavascriptExceptionObject * __thiscall
Js::ScriptContext::GetAndClearRecordedException(ScriptContext *this,bool *considerPassingToDebugger)

{
  code *pcVar1;
  bool bVar2;
  JavascriptExceptionObject *pJVar3;
  undefined4 *puVar4;
  JavascriptExceptionObject *exceptionObject;
  bool *considerPassingToDebugger_local;
  ScriptContext *this_local;
  
  pJVar3 = ThreadContext::GetRecordedException(this->threadContext);
  if (pJVar3 == (JavascriptExceptionObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xb1c,"(exceptionObject != nullptr)","exceptionObject != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (considerPassingToDebugger != (bool *)0x0) {
    bVar2 = ThreadContext::GetPropagateException(this->threadContext);
    *considerPassingToDebugger = bVar2;
  }
  pJVar3 = JavascriptExceptionObject::CloneIfStaticExceptionObject(pJVar3,this);
  ThreadContext::SetRecordedException(this->threadContext,(JavascriptExceptionObject *)0x0,false);
  return pJVar3;
}

Assistant:

Js::JavascriptExceptionObject * ScriptContext::GetAndClearRecordedException(bool *considerPassingToDebugger)
    {
        JavascriptExceptionObject * exceptionObject = this->threadContext->GetRecordedException();
        Assert(exceptionObject != nullptr);
        if (considerPassingToDebugger)
        {
            *considerPassingToDebugger = this->threadContext->GetPropagateException();
        }
        exceptionObject = exceptionObject->CloneIfStaticExceptionObject(this);
        this->threadContext->SetRecordedException(nullptr);
        return exceptionObject;
    }